

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefilter.cc
# Opt level: O0

Info * re2::Prefilter::Info::Plus(Info *a)

{
  Info *this;
  Prefilter *pPVar1;
  Info *ab;
  Info *a_local;
  
  this = (Info *)operator_new(0x40);
  Info(this);
  pPVar1 = TakeMatch(a);
  this->match_ = pPVar1;
  this->is_exact_ = false;
  if (a != (Info *)0x0) {
    ~Info(a);
    operator_delete(a);
  }
  return this;
}

Assistant:

Prefilter::Info* Prefilter::Info::Plus(Info *a) {
  Info *ab = new Info();

  ab->match_ = a->TakeMatch();
  ab->is_exact_ = false;

  delete a;
  return ab;
}